

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_construct.cc
# Opt level: O2

void __thiscall re2c::Binary::Binary(Binary *this,Span *s,uint32_t n,State *next)

{
  uint32_t uVar1;
  State *next_00;
  Cond *this_00;
  If *pIVar2;
  uint nsp;
  allocator<char> local_59;
  State *local_58;
  string local_50 [32];
  
  this->cond = (Cond *)0x0;
  this->thn = (If *)0x0;
  this->els = (If *)0x0;
  local_58 = next;
  this_00 = (Cond *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"<=",&local_59);
  nsp = n >> 1;
  uVar1 = s[nsp - 1].ub;
  std::__cxx11::string::string((string *)this_00,local_50);
  this_00->value = uVar1 - 1;
  this->cond = this_00;
  std::__cxx11::string::~string(local_50);
  pIVar2 = (If *)operator_new(0x10);
  next_00 = local_58;
  If::If(pIVar2,(uint)(n < 10),s,nsp,local_58);
  this->thn = pIVar2;
  pIVar2 = (If *)operator_new(0x10);
  If::If(pIVar2,(uint)(n - nsp < 5),s + nsp,n - nsp,next_00);
  this->els = pIVar2;
  return;
}

Assistant:

Binary::Binary (const Span * s, uint32_t n, const State * next)
	: cond (NULL)
	, thn (NULL)
	, els (NULL)
{
	const uint32_t l = n / 2;
	const uint32_t h = n - l;
	cond = new Cond ("<=", s[l - 1].ub - 1);
	thn = new If (l > 4 ? If::BINARY : If::LINEAR, &s[0], l, next);
	els = new If (h > 4 ? If::BINARY : If::LINEAR, &s[l], h, next);
}